

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::Q3BSPFileImporter::CreateTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,uint materialIdx,
          vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *rArray,
          aiMesh **pMesh)

{
  sQ3BSPFace *pQ3BSPFace;
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  aiMesh *this_00;
  size_t *psVar4;
  aiFace *paVar5;
  ulong uVar6;
  aiVector3D *paVar7;
  aiNode *this_01;
  uint *puVar8;
  aiFace *paVar9;
  ulong uVar10;
  size_t __n;
  Q3BSPFileImporter *this_02;
  aiMesh *this_03;
  pointer ppsVar11;
  uint vertIdx;
  uint faceIdx;
  
  this_02 = this;
  sVar2 = countData(this,rArray);
  if ((sVar2 != 0) && (sVar3 = countFaces(this_02,rArray), sVar3 != 0)) {
    this_00 = (aiMesh *)operator_new(0x520);
    this_03 = this_00;
    aiMesh::aiMesh(this_00);
    sVar3 = countTriangles((Q3BSPFileImporter *)this_03,rArray);
    this_00->mPrimitiveTypes = 4;
    psVar4 = (size_t *)operator_new__(-(ulong)(sVar3 >> 0x3c != 0) | sVar3 * 0x10 | 8);
    *psVar4 = sVar3;
    paVar5 = (aiFace *)(psVar4 + 1);
    if (sVar3 != 0) {
      paVar9 = paVar5;
      do {
        paVar9->mNumIndices = 0;
        paVar9->mIndices = (uint *)0x0;
        paVar9 = paVar9 + 1;
      } while (paVar9 != paVar5 + sVar3);
    }
    this_00->mFaces = paVar5;
    this_00->mNumFaces = (uint)sVar3;
    this_00->mNumVertices = (uint)sVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar6 = SUB168(auVar1 * ZEXT816(0xc),0);
    uVar10 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
      uVar10 = uVar6;
    }
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    __n = uVar6 - (uVar6 - 0xc) % 0xc;
    memset(paVar7,0,__n);
    this_00->mVertices = paVar7;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    memset(paVar7,0,__n);
    this_00->mNormals = paVar7;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    memset(paVar7,0,__n);
    this_00->mTextureCoords[0] = paVar7;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    memset(paVar7,0,__n);
    this_00->mTextureCoords[1] = paVar7;
    faceIdx = 0;
    vertIdx = 0;
    this_00->mMaterialIndex = materialIdx;
    this_00->mNumUVComponents[0] = 2;
    this_00->mNumUVComponents[1] = 2;
    ppsVar11 = (rArray->
               super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (ppsVar11 ==
          (rArray->
          super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_01);
        this_01->mNumMeshes = 1;
        puVar8 = (uint *)operator_new__(4);
        this_01->mMeshes = puVar8;
        *pMesh = this_00;
        return this_01;
      }
      pQ3BSPFace = *ppsVar11;
      if (pQ3BSPFace == (sQ3BSPFace *)0x0) break;
      if ((0 < pQ3BSPFace->iNumOfFaceVerts) && ((pQ3BSPFace->iType | 2U) == 3)) {
        createTriangleTopology(this,pModel,pQ3BSPFace,this_00,&faceIdx,&vertIdx);
      }
      ppsVar11 = ppsVar11 + 1;
    }
    __assert_fail("__null != pQ3BSPFace",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x160,
                  "aiNode *Assimp::Q3BSPFileImporter::CreateTopology(const Q3BSP::Q3BSPModel *, unsigned int, std::vector<sQ3BSPFace *> &, aiMesh **)"
                 );
  }
  return (aiNode *)0x0;
}

Assistant:

aiNode *Q3BSPFileImporter::CreateTopology( const Q3BSP::Q3BSPModel *pModel, unsigned int materialIdx,
        std::vector<sQ3BSPFace*> &rArray, aiMesh **pMesh ) {
    size_t numVerts = countData( rArray );
    if ( 0 == numVerts ) {
        return nullptr;
    }

    size_t numFaces = countFaces( rArray );
    if ( 0 == numFaces ) {
        return nullptr;
    }

    aiMesh *mesh = new aiMesh;
    size_t numTriangles = countTriangles( rArray );
    mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    mesh->mFaces = new aiFace[ numTriangles ];
    mesh->mNumFaces = static_cast<unsigned int>(numTriangles);

    mesh->mNumVertices = static_cast<unsigned int>(numVerts);
    mesh->mVertices = new aiVector3D[ numVerts ];
    mesh->mNormals =  new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 0 ] = new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 1 ] = new aiVector3D[ numVerts ];
    mesh->mMaterialIndex = materialIdx;

    unsigned int faceIdx = 0;
    unsigned int vertIdx = 0;
    mesh->mNumUVComponents[ 0 ] = 2;
    mesh->mNumUVComponents[ 1 ] = 2;
    for ( std::vector<sQ3BSPFace*>::const_iterator it = rArray.begin(); it != rArray.end(); ++it ) {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = *it;
        ai_assert( NULL != pQ3BSPFace );
        if ( nullptr == pQ3BSPFace ) {
            continue;
        }

        if ( pQ3BSPFace->iNumOfFaceVerts > 0 ) {
            if ( pQ3BSPFace->iType == Polygon || pQ3BSPFace->iType == TriangleMesh ) {
                createTriangleTopology( pModel, pQ3BSPFace, mesh, faceIdx, vertIdx );
            }
        }
    }

    aiNode *pNode = new aiNode;
    pNode->mNumMeshes = 1;
    pNode->mMeshes = new unsigned int[ 1 ];
    *pMesh = mesh;

    return pNode;
}